

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::SingleArena_CopyConstructSSO_Test::SingleArena_CopyConstructSSO_Test
          (SingleArena_CopyConstructSSO_Test *this)

{
  SingleArena::SingleArena(&this->super_SingleArena);
  (this->super_SingleArena).super_TestWithParam<bool>.super_Test._vptr_Test =
       (_func_int **)&PTR__TestWithParam_015f0a70;
  (this->super_SingleArena).super_TestWithParam<bool>.super_WithParamInterface<bool>.
  _vptr_WithParamInterface = (_func_int **)&PTR__SingleArena_CopyConstructSSO_Test_015f0ab0;
  return;
}

Assistant:

TEST_P(SingleArena, CopyConstructSSO) {
  std::string empty;
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitExternal(&empty);
  field.Set("Hello world", nullptr);

  ArenaStringPtr dst(arena.get(), field);
  EXPECT_EQ(dst.Get(), "Hello world");
  if (arena == nullptr) dst.Destroy();
  field.Destroy();
}